

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

uint If_CluGrp2Uns(If_Grp_t *pG)

{
  int local_20;
  uint local_1c;
  int i;
  uint Res;
  char *pChar;
  If_Grp_t *pG_local;
  
  local_1c = 0;
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    local_1c = ((int)pG->pVars[(long)local_20 + -2] & 0xfU) << ((byte)(local_20 << 2) & 0x1f) |
               local_1c;
  }
  return local_1c;
}

Assistant:

static inline unsigned If_CluGrp2Uns( If_Grp_t * pG )
{
    char * pChar = (char *)pG;
    unsigned Res = 0;
    int i;
    for ( i = 0; i < 8; i++ )
        Res |= ((pChar[i] & 15) << (i << 2));
    return Res;
}